

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O0

void __thiscall Memory::HeapInfo::Finalize(HeapInfo *this,RecyclerSweep *recyclerSweep)

{
  Recycler *pRVar1;
  uint local_28;
  uint local_24;
  uint i_1;
  uint i;
  Recycler *recycler;
  RecyclerSweep *recyclerSweep_local;
  HeapInfo *this_local;
  
  pRVar1 = RecyclerSweep::GetRecycler(recyclerSweep);
  memset((pRVar1->collectionStats).numEmptySmallBlocks,0,0x2c);
  (pRVar1->collectionStats).numZeroedOutSmallBlocks = 0;
  this->newFinalizableObjectCount = 0;
  VerifySmallHeapBlockCount(this);
  RecyclerSweep::
  MergePendingNewHeapBlockList<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>
            (recyclerSweep);
  RecyclerSweep::
  MergePendingNewMediumHeapBlockList<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>>
            (recyclerSweep);
  RecyclerSweep::
  MergePendingNewHeapBlockList<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>
            (recyclerSweep);
  RecyclerSweep::
  MergePendingNewMediumHeapBlockList<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>
            (recyclerSweep);
  LargeHeapBucket::Finalize(&this->largeObjectBucket);
  for (local_24 = 0; local_24 < 0x30; local_24 = local_24 + 1) {
    HeapBucketGroup<SmallAllocationBlockAttributes>::SweepFinalizableObjects
              (this->heapBuckets + local_24,recyclerSweep);
  }
  for (local_28 = 0; local_28 < 0x1d; local_28 = local_28 + 1) {
    HeapBucketGroup<MediumAllocationBlockAttributes>::SweepFinalizableObjects
              (this->mediumHeapBuckets + local_28,recyclerSweep);
  }
  return;
}

Assistant:

void
HeapInfo::Finalize(RecyclerSweep& recyclerSweep)
{
    Recycler * recycler = recyclerSweep.GetRecycler();
#ifdef RECYCLER_STATS
    memset(&recycler->collectionStats.numEmptySmallBlocks, 0, sizeof(recycler->collectionStats.numEmptySmallBlocks));
    recycler->collectionStats.numZeroedOutSmallBlocks = 0;
#endif
#ifdef RECYCLER_FINALIZE_CHECK
    this->newFinalizableObjectCount = 0;
#endif
    RECYCLER_SLOW_CHECK(VerifySmallHeapBlockCount());

#if ENABLE_CONCURRENT_GC
    // Merge the new blocks before we sweep the finalizable object in thread
    recyclerSweep.MergePendingNewHeapBlockList<SmallFinalizableHeapBlock>();
    recyclerSweep.MergePendingNewMediumHeapBlockList<MediumFinalizableHeapBlock>();

#ifdef RECYCLER_WRITE_BARRIER
    recyclerSweep.MergePendingNewHeapBlockList<SmallFinalizableWithBarrierHeapBlock>();
    recyclerSweep.MergePendingNewMediumHeapBlockList<MediumFinalizableWithBarrierHeapBlock>();
#endif
#ifdef RECYCLER_VISITED_HOST
    recyclerSweep.MergePendingNewHeapBlockList<SmallRecyclerVisitedHostHeapBlock>();
    recyclerSweep.MergePendingNewMediumHeapBlockList<MediumRecyclerVisitedHostHeapBlock>();
#endif
#endif

    RECYCLER_PROFILE_EXEC_BEGIN(recycler, Js::FinalizePhase);    

    largeObjectBucket.Finalize();

#if defined(BUCKETIZE_MEDIUM_ALLOCATIONS) && !(SMALLBLOCK_MEDIUM_ALLOC)
    for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
    {
        mediumHeapBuckets[i].Finalize();
    }
#endif

    for (uint i = 0; i < HeapConstants::BucketCount; i++)
    {
        heapBuckets[i].SweepFinalizableObjects(recyclerSweep);
    }

#if defined(BUCKETIZE_MEDIUM_ALLOCATIONS) && SMALLBLOCK_MEDIUM_ALLOC
    // CONCURRENT-TODO: Allow this in the background as well
    for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
    {
        mediumHeapBuckets[i].SweepFinalizableObjects(recyclerSweep);
    }
#endif

    RECYCLER_PROFILE_EXEC_END(recycler, Js::FinalizePhase);
}